

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

void Cec_GiaPrintCofStats2(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  uint v;
  
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  v = 0;
  while( true ) {
    if (p->vCis->nSize - p->nRegs <= (int)v) {
      return;
    }
    pObj = Gia_ManCi(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    p_00 = Gia_ManDupCofactorVar(p,v,0);
    p_01 = Gia_ManDupCofactorVar(p,v,1);
    printf("PI %5d :   ",(ulong)v);
    uVar1 = Gia_ObjRefNum(p,pObj);
    printf("Refs = %5d   ",(ulong)uVar1);
    uVar1 = Gia_ManAndNum(p_00);
    printf("Cof0 = %7d   ",(ulong)uVar1);
    uVar1 = Gia_ManAndNum(p_01);
    printf("Cof1 = %7d   ",(ulong)uVar1);
    putchar(10);
    Gia_ManStop(p_00);
    Gia_ManStop(p_01);
    v = v + 1;
  }
  return;
}

Assistant:

void Cec_GiaPrintCofStats2( Gia_Man_t * p )
{
    Gia_Man_t * pCof0, * pCof1;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        pCof0 = Gia_ManDupCofactorVar( p, i, 0 );
        pCof1 = Gia_ManDupCofactorVar( p, i, 1 );
        printf( "PI %5d :   ",   i );
        printf( "Refs = %5d   ", Gia_ObjRefNum(p, pObj) );
        printf( "Cof0 = %7d   ", Gia_ManAndNum(pCof0) );
        printf( "Cof1 = %7d   ", Gia_ManAndNum(pCof1) );
        printf( "\n" );
        Gia_ManStop( pCof0 );
        Gia_ManStop( pCof1 );
    }
}